

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absOldSat.c
# Opt level: O2

Abc_Cex_t * Saig_RefManReason2Cex(Saig_RefMan_t *p,Vec_Int_t *vReasons)

{
  int iVar1;
  int iVar2;
  Abc_Cex_t *pAVar3;
  int i;
  
  pAVar3 = Abc_CexDup(p->pCex,p->pCex->nRegs);
  i = 0;
  memset(pAVar3 + 1,0,
         (long)(int)(((pAVar3->nBits >> 5) + 1) - (uint)((pAVar3->nBits & 0x1fU) == 0)) << 2);
  while( true ) {
    if (vReasons->nSize <= i) {
      return pAVar3;
    }
    iVar1 = Vec_IntEntry(vReasons,i);
    if ((iVar1 < 0) || (p->pFrames->nObjs[2] <= iVar1)) break;
    iVar2 = Vec_IntEntry(p->vMapPiF2A,iVar1 * 2);
    iVar1 = Vec_IntEntry(p->vMapPiF2A,iVar1 * 2 + 1);
    iVar1 = iVar2 + pAVar3->nRegs + iVar1 * pAVar3->nPis;
    (&pAVar3[1].iPo)[iVar1 >> 5] = (&pAVar3[1].iPo)[iVar1 >> 5] | 1 << ((byte)iVar1 & 0x1f);
    i = i + 1;
  }
  __assert_fail("Entry >= 0 && Entry < Aig_ManCiNum(p->pFrames)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absOldSat.c"
                ,0x65,"Abc_Cex_t *Saig_RefManReason2Cex(Saig_RefMan_t *, Vec_Int_t *)");
}

Assistant:

Abc_Cex_t * Saig_RefManReason2Cex( Saig_RefMan_t * p, Vec_Int_t * vReasons )
{
    Abc_Cex_t * pCare;
    int i, Entry, iInput, iFrame;
    pCare = Abc_CexDup( p->pCex, p->pCex->nRegs );
    memset( pCare->pData, 0, sizeof(unsigned) * Abc_BitWordNum(pCare->nBits) );
    Vec_IntForEachEntry( vReasons, Entry, i )
    {
        assert( Entry >= 0 && Entry < Aig_ManCiNum(p->pFrames) );
        iInput = Vec_IntEntry( p->vMapPiF2A, 2*Entry );
        iFrame = Vec_IntEntry( p->vMapPiF2A, 2*Entry+1 );
        Abc_InfoSetBit( pCare->pData, pCare->nRegs + pCare->nPis * iFrame + iInput );
    }
    return pCare;
}